

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_q.cpp
# Opt level: O3

void produer(int p_num)

{
  bool bVar1;
  longlong lVar2;
  int i;
  int local_3c;
  id local_38;
  
  local_38._M_thread = pthread_self();
  lVar2 = tid_to_ll(&local_38);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] [tid:%lld] %d elements should be produced\n","info","produer",0x14,lVar2,
           p_num);
  }
  local_3c = 0;
  if (0 < p_num) {
    do {
      bVar1 = buffer_queue<int>::push(&g_q,&local_3c);
      if (bVar1) {
        if (1 < pr_level) {
          printf("[%-5s][%s:%d] +++[tid:%lld] produced no.%d element\n","info","produer",0x1f,lVar2,
                 (ulong)(local_3c + 1));
        }
        LOCK();
        g_p_cnt.super___atomic_base<int>._M_i =
             (__atomic_base<int>)((int)g_p_cnt.super___atomic_base<int>._M_i + 1);
        UNLOCK();
        local_3c = local_3c + 1;
      }
      else if (1 < pr_level) {
        printf("[%-5s][%s:%d] ***[tid:%lld] push fail, buffer queue is full\n","info","produer",0x1b
               ,lVar2);
      }
    } while (local_3c < p_num);
  }
  return;
}

Assistant:

void produer(int p_num)
{
    long long tid = tid_to_ll(this_thread::get_id());
    PR_INFO("[tid:%lld] %d elements should be produced\n", tid, p_num);
    int i = 0;
    while(i<p_num)
    {
        bool ret = g_q.push(i);
        if(!ret)
        {
            PR_INFO("***[tid:%lld] push fail, buffer queue is full\n", tid);
        }
        else
        {
            PR_INFO("+++[tid:%lld] produced no.%d element\n", tid, i+1);
            g_p_cnt.fetch_add(1);
            i++;
        }
        
    }
}